

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

Vec_Ptr_t * Prs_ManReadVerilog(char *pFileName)

{
  int iVar1;
  Prs_Man_t *p_00;
  Vec_Ptr_t *t;
  Prs_Man_t *p;
  Vec_Ptr_t *vPrs;
  char *pFileName_local;
  
  p = (Prs_Man_t *)0x0;
  p_00 = Prs_ManAlloc(pFileName);
  if (p_00 == (Prs_Man_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    Abc_NamStrFindOrAdd(p_00->pFuns,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(p_00->pFuns,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(p_00->pFuns,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(p_00->pFuns,"1\'bz",(int *)0x0);
    Prs_NtkAddVerilogDirectives(p_00);
    Prs_ManReadDesign(p_00);
    Prs_ManPrintModules(p_00);
    iVar1 = Prs_ManErrorPrint(p_00);
    if (iVar1 != 0) {
      p = (Prs_Man_t *)p_00->vNtks;
      p_00->vNtks = (Vec_Ptr_t *)0x0;
    }
    Prs_ManFree(p_00);
    pFileName_local = (char *)p;
  }
  return (Vec_Ptr_t *)pFileName_local;
}

Assistant:

Vec_Ptr_t * Prs_ManReadVerilog( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b0", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b1", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bx", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bz", NULL );
    Prs_NtkAddVerilogDirectives( p );
    Prs_ManReadDesign( p );   
    Prs_ManPrintModules( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}